

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O3

void __thiscall
CMU462::StaticScene::BVHAccel::BVHAccel
          (BVHAccel *this,
          vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
          *_primitives,size_t max_leaf_size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  pointer ppPVar3;
  BVHNode *pBVar4;
  ulong uVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [12];
  undefined4 uStack_9c;
  undefined1 local_98 [16];
  double local_88;
  double dStack_80;
  double local_78;
  undefined1 local_68 [16];
  double local_58;
  double dStack_50;
  undefined1 local_48 [16];
  
  (this->super_Aggregate).primitives.
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Aggregate).primitives.
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Aggregate).primitives.
  super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Aggregate).super_Primitive._vptr_Primitive = (_func_int **)&PTR_get_bbox_0026be68;
  std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>::
  operator=(&(this->super_Aggregate).primitives,_primitives);
  ppPVar3 = (this->super_Aggregate).primitives.
            super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_Aggregate).primitives.
      super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
      ._M_impl.super__Vector_impl_data._M_finish == ppPVar3) {
    sVar6 = 0;
    stack0xffffffffffffff60 = INFINITY;
    local_a8._0_8_ = 0x7ff0000000000000;
    local_b8._8_8_ = 0x7ff0000000000000;
    local_b8._0_8_ = 0xfff0000000000000;
    local_78 = -INFINITY;
    local_98._8_8_ = 0xfff0000000000000;
    local_98._0_8_ = 0xfff0000000000000;
    local_88 = -INFINITY;
    dStack_80 = -INFINITY;
  }
  else {
    local_b8._8_8_ = 0x7ff0000000000000;
    local_b8._0_8_ = 0xfff0000000000000;
    local_a8._0_4_ = 0;
    local_a8._4_4_ = 0xfff00000;
    local_a8._8_4_ = 0;
    uStack_9c = 0xfff00000;
    uVar5 = 0;
    auVar8 = _DAT_001e3c80;
    do {
      (**ppPVar3[uVar5]->_vptr_Primitive)(local_68);
      local_98 = maxpd(local_68,_local_a8);
      auVar8 = minpd(local_48,auVar8);
      uVar2 = (ulong)dStack_50 & -(ulong)(dStack_50 < (double)local_b8._8_8_);
      auVar7._0_8_ = ~-(ulong)((double)local_b8._0_8_ < local_58) & local_b8._0_8_;
      auVar7._8_8_ = ~-(ulong)(dStack_50 < (double)local_b8._8_8_) & local_b8._8_8_;
      auVar1._8_4_ = (int)uVar2;
      auVar1._0_8_ = (ulong)local_58 & -(ulong)((double)local_b8._0_8_ < local_58);
      auVar1._12_4_ = (int)(uVar2 >> 0x20);
      local_b8 = auVar7 | auVar1;
      uVar5 = uVar5 + 1;
      ppPVar3 = (this->super_Aggregate).primitives.
                super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      sVar6 = (long)(this->super_Aggregate).primitives.
                    super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar3 >> 3;
      local_a8._0_4_ = local_98._0_4_;
      local_a8._4_4_ = local_98._4_4_;
      local_a8._8_4_ = local_98._8_4_;
      uStack_9c = local_98._12_4_;
    } while (uVar5 < sVar6);
    local_88 = local_98._0_8_ - (double)local_b8._8_8_;
    dStack_80 = local_98._8_8_ - auVar8._0_8_;
    local_78 = (double)local_b8._0_8_ - auVar8._8_8_;
    _local_a8 = auVar8;
  }
  pBVar4 = (BVHNode *)operator_new(0x68);
  (pBVar4->bb).max.x = (double)local_98._0_8_;
  (pBVar4->bb).max.y = (double)local_98._8_8_;
  (pBVar4->bb).max.z = (double)local_b8._0_8_;
  (pBVar4->bb).min.x = (double)local_b8._8_8_;
  (pBVar4->bb).min.y = (double)local_a8._0_8_;
  (pBVar4->bb).min.z = stack0xffffffffffffff60;
  (pBVar4->bb).extent.x = local_88;
  (pBVar4->bb).extent.y = dStack_80;
  (pBVar4->bb).extent.z = local_78;
  pBVar4->start = 0;
  pBVar4->range = sVar6;
  pBVar4->l = (BVHNode *)0x0;
  pBVar4->r = (BVHNode *)0x0;
  this->root = pBVar4;
  return;
}

Assistant:

BVHAccel::BVHAccel(const std::vector<Primitive *> &_primitives,
      size_t max_leaf_size) {

    this->primitives = _primitives;

    // TODO:
    // Construct a BVH from the given vector of primitives and maximum leaf
    // size configuration. The starter code build a BVH aggregate with a
    // single leaf node (which is also the root) that encloses all the
    // primitives.

    BBox bb;
    for (size_t i = 0; i < primitives.size(); ++i) {
      bb.expand(primitives[i]->get_bbox());
    }

    root = new BVHNode(bb, 0, primitives.size());

  }